

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

outer_range_iterator __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
::skip_while_less(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
                  *this,outer_range_iterator range,outer_range_iterator candidate)

{
  reference piVar1;
  reference piVar2;
  
  do {
    if (range._M_current == candidate._M_current) {
      return (outer_range_iterator)range._M_current;
    }
    piVar1 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                       ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                         *)range._M_current);
    piVar2 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                       ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                         *)candidate._M_current);
    if (*piVar2 < *piVar1) {
      piVar1 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      *)candidate._M_current);
      skip_to_lower_bound<boost::iterator_range<int_const*>,int,std::greater<void>>
                (range._M_current,piVar1);
      if (((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
          range._M_current)->m_Begin ==
          ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
          range._M_current)->m_End) {
        return (outer_range_iterator)range._M_current;
      }
      piVar1 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      *)candidate._M_current);
      piVar2 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      *)range._M_current);
      if (*piVar2 < *piVar1) {
        return (outer_range_iterator)range._M_current;
      }
    }
    range._M_current =
         (iterator_range<const_int_*> *)
         ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
          range._M_current + 1);
  } while( true );
}

Assistant:

outer_range_iterator skip_while_less (outer_range_iterator range, outer_range_iterator candidate)
        {
            while (range != candidate)
            {
                if (m_compare(range->front(), candidate->front()))
                {
                    skip_to_lower_bound(*range, candidate->front(), m_compare);
                    if (range->empty() || m_compare(candidate->front(), range->front()))
                    {
                        break;
                    }
                }

                ++range;
            }

            return range;
        }